

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

Value * duckdb::Vector::GetValueInternal(Value *__return_storage_ptr__,Vector *v_p,idx_t index_p)

{
  uint *puVar1;
  LogicalTypeId LVar2;
  PhysicalType PVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  long *plVar6;
  long lVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pVVar12;
  pointer pVVar13;
  bool bVar14;
  uint8_t width;
  uint8_t scale;
  bool bVar15;
  VectorBuffer *pVVar16;
  FSSTPrimitives *this;
  vector<unsigned_char,_true> *compressed_string_len;
  VectorBuffer *pVVar17;
  long lVar18;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference this_01;
  string *psVar19;
  pointer v_p_00;
  idx_t iVar20;
  Vector *pVVar21;
  LogicalType *pLVar22;
  InternalException *pIVar23;
  uint uVar24;
  PhysicalType type;
  pointer duckdb_fsst_decoder;
  LogicalType *type_00;
  element_type *peVar25;
  long lVar26;
  Value *pVVar27;
  size_type __n;
  int64_t value;
  uint64_t value_00;
  _Alloc_hider _Var28;
  vector<unsigned_char,_true> *in_R9;
  ulong uVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  idx_t iVar31;
  uhugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  hugeint_t value_04;
  child_list_t<LogicalType> members;
  string string_val;
  string_t str_compressed;
  undefined1 local_248 [64];
  undefined1 local_208 [8];
  element_type *peStack_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  Value local_1e8;
  undefined1 local_1a8 [8];
  pointer ppStack_1a0;
  pointer local_198;
  vector<duckdb::Value,_true> local_188;
  vector<duckdb::Value,_true> local_168;
  string local_150;
  child_list_t<LogicalType> local_130;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_118;
  LogicalType local_f8;
  string local_e0;
  LogicalType local_c0;
  string local_a8;
  Value local_88;
  vector<duckdb::Value,_true> local_48;
  
  iVar31 = index_p;
  bVar15 = false;
  do {
    bVar14 = true;
    switch(v_p->vector_type) {
    case FLAT_VECTOR:
    case FSST_VECTOR:
      break;
    case CONSTANT_VECTOR:
      iVar31 = 0;
      break;
    case DICTIONARY_VECTOR:
      DictionaryVector::VerifyDictionary(v_p);
      pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&v_p->buffer);
      DictionaryVector::VerifyDictionary(v_p);
      pVVar16 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&v_p->auxiliary);
      v_p = (Vector *)(pVVar16 + 1);
      bVar14 = bVar15;
      if (pVVar17[1]._vptr_VectorBuffer != (_func_int **)0x0) {
        iVar31 = (idx_t)*(uint *)((long)pVVar17[1]._vptr_VectorBuffer + iVar31 * 4);
      }
      break;
    case SEQUENCE_VECTOR:
      pVVar17 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&v_p->buffer);
      plVar6 = (long *)(pVVar17->data).pointer;
      lVar26 = *plVar6;
      lVar7 = plVar6[1];
      lVar18 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar31);
      Value::Numeric(__return_storage_ptr__,&v_p->type,lVar7 * lVar18 + lVar26);
      return __return_storage_ptr__;
    default:
      pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
      local_208 = (undefined1  [8])&local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"Unimplemented vector type for Vector::GetValue","");
      InternalException::InternalException(pIVar23,(string *)local_208);
      __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar15 = bVar14;
  } while (!bVar14);
  pdVar4 = v_p->data;
  puVar5 = (v_p->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pLVar22 = &v_p->type;
  if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[iVar31 >> 6] >> (iVar31 & 0x3f) & 1) == 0)) {
    LogicalType::LogicalType(&local_c0,pLVar22);
    Value::Value(__return_storage_ptr__,&local_c0);
    pLVar22 = &local_c0;
LAB_01330144:
    LogicalType::~LogicalType(pLVar22);
    return __return_storage_ptr__;
  }
  if (v_p->vector_type == FSST_VECTOR) {
    if ((v_p->type).physical_type_ != VARCHAR) {
      pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
      local_208 = (undefined1  [8])&local_1f8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"FSST Vector with non-string datatype found!","");
      InternalException::InternalException(pIVar23,(string *)local_208);
      __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1a8 = *(undefined1 (*) [8])(pdVar4 + iVar31 * 0x10);
    ppStack_1a0 = *(pointer *)((long)(pdVar4 + iVar31 * 0x10) + 8);
    this = (FSSTPrimitives *)FSSTVector::GetDecoder(v_p);
    compressed_string_len = FSSTVector::GetDecompressBuffer(v_p);
    duckdb_fsst_decoder = ppStack_1a0;
    if ((char *)((ulong)local_1a8 & 0xffffffff) < (char *)0xd) {
      duckdb_fsst_decoder = (pointer)(local_1a8 + 4);
    }
    FSSTPrimitives::DecompressValue_abi_cxx11_
              ((string *)local_208,this,duckdb_fsst_decoder,(char *)((ulong)local_1a8 & 0xffffffff),
               (idx_t)compressed_string_len,in_R9);
    LVar2 = (v_p->type).id_;
    if (LVar2 == VARCHAR) {
      if (local_208 == (undefined1  [8])&local_1f8) {
        local_150.field_2._8_8_ = local_1f8._8_8_;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150._M_dataplus._M_p = (pointer)local_208;
      }
      local_150._M_string_length = (size_type)peStack_200;
      peStack_200 = (element_type *)0x0;
      local_1f8._M_local_buf[0] = '\0';
      local_208 = (undefined1  [8])&local_1f8;
      Value::Value(__return_storage_ptr__,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
    }
    else {
      if (LVar2 != BLOB) {
        pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
        local_248._0_8_ = local_248 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"Unsupported vector type for FSST vector","");
        InternalException::InternalException(pIVar23,(string *)local_248);
        __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::BLOB(__return_storage_ptr__,(const_data_ptr_t)local_208,(idx_t)peStack_200);
    }
    _Var28._M_p = (pointer)local_208;
    if (local_208 == (undefined1  [8])&local_1f8) {
      return __return_storage_ptr__;
    }
  }
  else {
    LVar2 = pLVar22->id_;
    uVar24 = LVar2 - 10;
    if (uVar24 < 0x2d) {
      value_01.upper =
           (long)&switchD_013300c0::switchdataD_01e20698 +
           (long)(int)(&switchD_013300c0::switchdataD_01e20698)[uVar24];
      switch((uint)LVar2) {
      case 10:
        Value::BOOLEAN(__return_storage_ptr__,(bool)pdVar4[iVar31]);
        return __return_storage_ptr__;
      case 0xb:
        Value::TINYINT(__return_storage_ptr__,pdVar4[iVar31]);
        return __return_storage_ptr__;
      case 0xc:
        Value::SMALLINT(__return_storage_ptr__,*(int16_t *)(pdVar4 + iVar31 * 2));
        return __return_storage_ptr__;
      case 0xd:
        Value::INTEGER(__return_storage_ptr__,*(int32_t *)(pdVar4 + iVar31 * 4));
        return __return_storage_ptr__;
      case 0xe:
        Value::BIGINT(__return_storage_ptr__,*(int64_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0xf:
        Value::DATE(__return_storage_ptr__,(date_t)*(int32_t *)(pdVar4 + iVar31 * 4));
        return __return_storage_ptr__;
      case 0x10:
        Value::TIME(__return_storage_ptr__,(dtime_t)*(int64_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0x11:
        Value::TIMESTAMPSEC(__return_storage_ptr__,
                            (timestamp_sec_t)((timestamp_t *)(pdVar4 + iVar31 * 8))->value);
        return __return_storage_ptr__;
      case 0x12:
        Value::TIMESTAMPMS(__return_storage_ptr__,
                           (timestamp_ms_t)((timestamp_t *)(pdVar4 + iVar31 * 8))->value);
        return __return_storage_ptr__;
      case 0x13:
        Value::TIMESTAMP(__return_storage_ptr__,(timestamp_t)*(int64_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0x14:
        Value::TIMESTAMPNS(__return_storage_ptr__,
                           (timestamp_ns_t)((timestamp_t *)(pdVar4 + iVar31 * 8))->value);
        return __return_storage_ptr__;
      case 0x15:
        width = DecimalType::GetWidth(pLVar22);
        scale = DecimalType::GetScale(pLVar22);
        PVar3 = (v_p->type).physical_type_;
        if (PVar3 < INT64) {
          if (PVar3 == INT16) {
            value = (int64_t)*(short *)(pdVar4 + iVar31 * 2);
          }
          else {
            if (PVar3 != INT32) goto LAB_01330db4;
            value = (int64_t)*(int *)(pdVar4 + iVar31 * 4);
          }
        }
        else {
          if (PVar3 != INT64) {
            if (PVar3 == INT128) {
              value_04.upper = *(int64_t *)(pdVar4 + iVar31 * 0x10 + 8);
              value_04.lower = *(uint64_t *)(pdVar4 + iVar31 * 0x10);
              Value::DECIMAL(__return_storage_ptr__,value_04,width,scale);
              return __return_storage_ptr__;
            }
LAB_01330db4:
            pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
            local_208 = (undefined1  [8])&local_1f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_208,
                       "Physical type \'%s\' has a width bigger than 38, which is not supported","")
            ;
            TypeIdToString_abi_cxx11_(&local_a8,(duckdb *)(ulong)(v_p->type).physical_type_,type);
            InternalException::InternalException<std::__cxx11::string>
                      (pIVar23,(string *)local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8);
            __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          value = *(int64_t *)(pdVar4 + iVar31 * 8);
        }
        Value::DECIMAL(__return_storage_ptr__,value,width,scale);
        return __return_storage_ptr__;
      case 0x16:
        Value::FLOAT(__return_storage_ptr__,*(float *)(pdVar4 + iVar31 * 4));
        return __return_storage_ptr__;
      case 0x17:
        Value::DOUBLE(__return_storage_ptr__,*(double *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      default:
        goto switchD_013300c0_caseD_18;
      case 0x19:
        puVar1 = (uint *)(pdVar4 + iVar31 * 0x10);
        local_208 = *(undefined1 (*) [8])puVar1;
        peStack_200 = *(element_type **)(puVar1 + 2);
        peVar25 = peStack_200;
        if ((ulong)*puVar1 < 0xd) {
          peVar25 = (element_type *)(local_208 + 4);
        }
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,peVar25,
                   (undefined1 *)((long)&peVar25->_vptr_ExtraTypeInfo + (ulong)*puVar1));
        Value::Value(__return_storage_ptr__,&local_e0);
        _Var28._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
          return __return_storage_ptr__;
        }
        break;
      case 0x1a:
        local_208 = *(undefined1 (*) [8])(pdVar4 + iVar31 * 0x10);
        peStack_200 = *(element_type **)((long)(pdVar4 + iVar31 * 0x10) + 8);
        peVar25 = peStack_200;
        if (((ulong)local_208 & 0xffffffff) < 0xd) {
          peVar25 = (element_type *)(local_208 + 4);
        }
        Value::BLOB(__return_storage_ptr__,(const_data_ptr_t)peVar25,(ulong)local_208 & 0xffffffff);
        return __return_storage_ptr__;
      case 0x1b:
        Value::INTERVAL(__return_storage_ptr__,(int32_t)*(undefined8 *)(pdVar4 + iVar31 * 0x10),
                        (int32_t)((ulong)*(undefined8 *)(pdVar4 + iVar31 * 0x10) >> 0x20),
                        *(int64_t *)(pdVar4 + iVar31 * 0x10 + 8));
        return __return_storage_ptr__;
      case 0x1c:
        Value::UTINYINT(__return_storage_ptr__,pdVar4[iVar31]);
        return __return_storage_ptr__;
      case 0x1d:
        Value::USMALLINT(__return_storage_ptr__,*(uint16_t *)(pdVar4 + iVar31 * 2));
        return __return_storage_ptr__;
      case 0x1e:
        Value::UINTEGER(__return_storage_ptr__,*(uint32_t *)(pdVar4 + iVar31 * 4));
        return __return_storage_ptr__;
      case 0x1f:
        Value::UBIGINT(__return_storage_ptr__,*(uint64_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0x20:
        Value::TIMESTAMPTZ(__return_storage_ptr__,
                           (timestamp_tz_t)((timestamp_t *)(pdVar4 + iVar31 * 8))->value);
        return __return_storage_ptr__;
      case 0x22:
        Value::TIMETZ(__return_storage_ptr__,(dtime_tz_t)*(uint64_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0x24:
        local_208 = *(undefined1 (*) [8])(pdVar4 + iVar31 * 0x10);
        peStack_200 = *(element_type **)((long)(pdVar4 + iVar31 * 0x10) + 8);
        peVar25 = peStack_200;
        if (((ulong)local_208 & 0xffffffff) < 0xd) {
          peVar25 = (element_type *)(local_208 + 4);
        }
        Value::BIT(__return_storage_ptr__,(const_data_ptr_t)peVar25,(ulong)local_208 & 0xffffffff);
        return __return_storage_ptr__;
      case 0x27:
        local_208 = *(undefined1 (*) [8])(pdVar4 + iVar31 * 0x10);
        peStack_200 = *(element_type **)((long)(pdVar4 + iVar31 * 0x10) + 8);
        peVar25 = peStack_200;
        if (((ulong)local_208 & 0xffffffff) < 0xd) {
          peVar25 = (element_type *)(local_208 + 4);
        }
        Value::VARINT(__return_storage_ptr__,(const_data_ptr_t)peVar25,(ulong)local_208 & 0xffffffff
                     );
        return __return_storage_ptr__;
      case 0x31:
        value_01.lower = *(uint64_t *)(pdVar4 + iVar31 * 0x10 + 8);
        Value::UHUGEINT(__return_storage_ptr__,*(Value **)(pdVar4 + iVar31 * 0x10),value_01);
        return __return_storage_ptr__;
      case 0x32:
        value_02.upper = value_01.upper;
        value_02.lower = *(uint64_t *)(pdVar4 + iVar31 * 0x10 + 8);
        Value::HUGEINT(__return_storage_ptr__,*(Value **)(pdVar4 + iVar31 * 0x10),value_02);
        return __return_storage_ptr__;
      case 0x33:
        Value::POINTER(__return_storage_ptr__,*(uintptr_t *)(pdVar4 + iVar31 * 8));
        return __return_storage_ptr__;
      case 0x36:
        value_03.upper = value_01.upper;
        value_03.lower = *(uint64_t *)(pdVar4 + iVar31 * 0x10 + 8);
        Value::UUID(__return_storage_ptr__,*(Value **)(pdVar4 + iVar31 * 0x10),value_03);
        return __return_storage_ptr__;
      }
    }
    else {
      switch(LVar2) {
      case STRUCT:
        this_00 = StructVector::GetEntries(v_p);
        local_1a8 = (undefined1  [8])0x0;
        ppStack_1a0 = (pointer)0x0;
        local_198 = (pointer)0x0;
        if ((this_00->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this_00->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::operator[](this_00,__n);
            psVar19 = StructType::GetChildName_abi_cxx11_(pLVar22,__n);
            v_p_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                     operator->(this_01);
            GetValue((Value *)local_248,v_p_00,index_p);
            local_208 = (undefined1  [8])&local_1f8;
            pcVar8 = (psVar19->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,pcVar8,pcVar8 + psVar19->_M_string_length);
            Value::Value(&local_1e8,(Value *)local_248);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
            ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                      ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                        *)local_1a8,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                        *)local_208);
            Value::~Value(&local_1e8);
            if (local_208 != (undefined1  [8])&local_1f8) {
              operator_delete((void *)local_208);
            }
            Value::~Value((Value *)local_248);
            __n = __n + 1;
          } while (__n < (ulong)((long)(this_00->
                                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->
                                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        local_118.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8;
        local_118.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppStack_1a0;
        local_118.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_198;
        local_1a8 = (undefined1  [8])0x0;
        ppStack_1a0 = (pointer)0x0;
        local_198 = (pointer)0x0;
        Value::STRUCT(__return_storage_ptr__,(child_list_t<Value> *)&local_118);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector(&local_118);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)local_1a8);
        return __return_storage_ptr__;
      case LIST:
        uVar29 = *(ulong *)(pdVar4 + iVar31 * 0x10);
        lVar26 = *(long *)(pdVar4 + iVar31 * 0x10 + 8);
        pVVar21 = ListVector::GetEntryInternal<duckdb::Vector_const>(v_p);
        local_248._0_8_ = (Value *)0x0;
        local_248._8_8_ = (Value *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (uVar29 < lVar26 + uVar29) {
          do {
            GetValue((Value *)local_208,pVVar21,uVar29);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_248,
                       (Value *)local_208);
            Value::~Value((Value *)local_208);
            uVar29 = uVar29 + 1;
            lVar26 = lVar26 + -1;
          } while (lVar26 != 0);
        }
        pLVar22 = ListType::GetChildType(pLVar22);
        local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Value::LIST(__return_storage_ptr__,pLVar22,&local_168);
        pVVar13 = local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pVVar12 = local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (pVVar27 = local_168.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start; pVVar27 != pVVar13; pVVar27 = pVVar27 + 1)
        {
          Value::~Value(pVVar27);
        }
        paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_248._8_8_;
        if (pVVar12 != (Value *)0x0) {
          operator_delete(pVVar12);
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._0_8_;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_248._8_8_;
        }
        for (; paVar30 != paVar9; paVar30 = paVar30 + 4) {
          Value::~Value((Value *)paVar30);
        }
        break;
      case MAP:
        uVar29 = *(ulong *)(pdVar4 + iVar31 * 0x10);
        lVar26 = *(long *)(pdVar4 + iVar31 * 0x10 + 8);
        pVVar21 = ListVector::GetEntryInternal<duckdb::Vector_const>(v_p);
        local_248._0_8_ = (Value *)0x0;
        local_248._8_8_ = (Value *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (uVar29 < lVar26 + uVar29) {
          do {
            GetValue((Value *)local_208,pVVar21,uVar29);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_248,
                       (Value *)local_208);
            Value::~Value((Value *)local_208);
            uVar29 = uVar29 + 1;
            lVar26 = lVar26 + -1;
          } while (lVar26 != 0);
        }
        pLVar22 = ListType::GetChildType(pLVar22);
        uVar11 = local_248._8_8_;
        uVar10 = local_248._0_8_;
        local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Value::MAP(__return_storage_ptr__,pLVar22,&local_48);
        for (pVVar27 = (Value *)uVar10; pVVar27 != (Value *)uVar11; pVVar27 = pVVar27 + 1) {
          Value::~Value(pVVar27);
        }
        paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_248._8_8_;
        if ((Value *)uVar10 != (Value *)0x0) {
          operator_delete((void *)uVar10);
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._0_8_;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_248._8_8_;
        }
        for (; paVar30 != paVar9; paVar30 = paVar30 + 4) {
          Value::~Value((Value *)paVar30);
        }
        break;
      default:
switchD_013300c0_caseD_18:
        pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
        local_208 = (undefined1  [8])&local_1f8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"Unimplemented type for value access","");
        InternalException::InternalException(pIVar23,(string *)local_208);
        __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case ENUM:
        PVar3 = (v_p->type).physical_type_;
        if (PVar3 == UINT32) {
          value_00 = (uint64_t)*(uint *)(pdVar4 + iVar31 * 4);
        }
        else if (PVar3 == UINT16) {
          value_00 = (uint64_t)*(ushort *)(pdVar4 + iVar31 * 2);
        }
        else {
          if (PVar3 != UINT8) {
            pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
            local_208 = (undefined1  [8])&local_1f8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_208,"ENUM can only have unsigned integers as physical types",
                       "");
            InternalException::InternalException(pIVar23,(string *)local_208);
            __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          value_00 = (uint64_t)pdVar4[iVar31];
        }
        Value::ENUM(__return_storage_ptr__,value_00,pLVar22);
        return __return_storage_ptr__;
      case AGGREGATE_STATE:
        local_208 = *(undefined1 (*) [8])(pdVar4 + iVar31 * 0x10);
        peStack_200 = *(element_type **)((long)(pdVar4 + iVar31 * 0x10) + 8);
        peVar25 = peStack_200;
        if (((ulong)local_208 & 0xffffffff) < 0xd) {
          peVar25 = (element_type *)(local_208 + 4);
        }
        Value::AGGREGATE_STATE
                  (__return_storage_ptr__,pLVar22,(const_data_ptr_t)peVar25,
                   (ulong)local_208 & 0xffffffff);
        return __return_storage_ptr__;
      case UNION:
        bVar15 = UnionVector::TryGetTag(v_p,index_p,local_1a8);
        if (bVar15) {
          pVVar21 = UnionVector::GetMember(v_p,(ulong)local_1a8 & 0xff);
          GetValue((Value *)local_208,pVVar21,index_p);
          UnionType::CopyMemberTypes_abi_cxx11_
                    ((child_list_t<LogicalType> *)local_248,(UnionType *)pLVar22,type_00);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)&local_130,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    *)local_248);
          Value::Value(&local_88,(Value *)local_208);
          Value::UNION(__return_storage_ptr__,&local_130,(uint8_t)local_1a8[0],&local_88);
          Value::~Value(&local_88);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)&local_130);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)local_248);
          Value::~Value((Value *)local_208);
          return __return_storage_ptr__;
        }
        LogicalType::LogicalType(&local_f8,pLVar22);
        Value::Value(__return_storage_ptr__,&local_f8);
        pLVar22 = &local_f8;
        goto LAB_01330144;
      case ARRAY:
        iVar20 = ArrayType::GetSize(pLVar22);
        iVar31 = iVar31 * iVar20;
        pVVar21 = ArrayVector::GetEntryInternal<duckdb::Vector_const>(v_p);
        local_248._0_8_ = (Value *)0x0;
        local_248._8_8_ = (Value *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar31 < iVar31 + iVar20) {
          do {
            GetValue((Value *)local_208,pVVar21,iVar31);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_248,
                       (Value *)local_208);
            Value::~Value((Value *)local_208);
            iVar31 = iVar31 + 1;
            iVar20 = iVar20 - 1;
          } while (iVar20 != 0);
        }
        pLVar22 = ArrayType::GetChildType(pLVar22);
        local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_248._16_8_;
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Value::ARRAY(__return_storage_ptr__,pLVar22,&local_188);
        pVVar13 = local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pVVar12 = local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (pVVar27 = local_188.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start; pVVar27 != pVVar13; pVVar27 = pVVar27 + 1)
        {
          Value::~Value(pVVar27);
        }
        paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._0_8_;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_248._8_8_;
        if (pVVar12 != (Value *)0x0) {
          operator_delete(pVVar12);
          paVar30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._0_8_;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_248._8_8_;
        }
        for (; paVar30 != paVar9; paVar30 = paVar30 + 4) {
          Value::~Value((Value *)paVar30);
        }
      }
      _Var28._M_p = (pointer)local_248._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return __return_storage_ptr__;
      }
    }
  }
  operator_delete(_Var28._M_p);
  return __return_storage_ptr__;
}

Assistant:

Value Vector::GetValueInternal(const Vector &v_p, idx_t index_p) {
	const Vector *vector = &v_p;
	idx_t index = index_p;
	bool finished = false;
	while (!finished) {
		switch (vector->GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			index = 0;
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		// dictionary: apply dictionary and forward to child
		case VectorType::DICTIONARY_VECTOR: {
			auto &sel_vector = DictionaryVector::SelVector(*vector);
			auto &child = DictionaryVector::Child(*vector);
			vector = &child;
			index = sel_vector.get_index(index);
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			SequenceVector::GetSequence(*vector, start, increment);
			return Value::Numeric(vector->GetType(), start + increment * NumericCast<int64_t>(index));
		}
		default:
			throw InternalException("Unimplemented vector type for Vector::GetValue");
		}
	}
	auto data = vector->data;
	auto &validity = vector->validity;
	auto &type = vector->GetType();

	if (!validity.RowIsValid(index)) {
		return Value(vector->GetType());
	}

	if (vector->GetVectorType() == VectorType::FSST_VECTOR) {
		if (vector->GetType().InternalType() != PhysicalType::VARCHAR) {
			throw InternalException("FSST Vector with non-string datatype found!");
		}
		auto str_compressed = reinterpret_cast<string_t *>(data)[index];
		auto decoder = FSSTVector::GetDecoder(*vector);
		auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*vector);
		auto string_val = FSSTPrimitives::DecompressValue(decoder, str_compressed.GetData(), str_compressed.GetSize(),
		                                                  decompress_buffer);
		switch (vector->GetType().id()) {
		case LogicalTypeId::VARCHAR:
			return Value(std::move(string_val));
		case LogicalTypeId::BLOB:
			return Value::BLOB_RAW(string_val);
		default:
			throw InternalException("Unsupported vector type for FSST vector");
		}
	}

	switch (vector->GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(reinterpret_cast<bool *>(data)[index]);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(reinterpret_cast<int8_t *>(data)[index]);
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(reinterpret_cast<int16_t *>(data)[index]);
	case LogicalTypeId::INTEGER:
		return Value::INTEGER(reinterpret_cast<int32_t *>(data)[index]);
	case LogicalTypeId::DATE:
		return Value::DATE(reinterpret_cast<date_t *>(data)[index]);
	case LogicalTypeId::TIME:
		return Value::TIME(reinterpret_cast<dtime_t *>(data)[index]);
	case LogicalTypeId::TIME_TZ:
		return Value::TIMETZ(reinterpret_cast<dtime_tz_t *>(data)[index]);
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(reinterpret_cast<int64_t *>(data)[index]);
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(reinterpret_cast<uint8_t *>(data)[index]);
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(reinterpret_cast<uint16_t *>(data)[index]);
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(reinterpret_cast<uint32_t *>(data)[index]);
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(reinterpret_cast<uint64_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(reinterpret_cast<timestamp_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(reinterpret_cast<timestamp_ns_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(reinterpret_cast<timestamp_ms_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(reinterpret_cast<timestamp_sec_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(reinterpret_cast<timestamp_tz_t *>(data)[index]);
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(reinterpret_cast<uhugeint_t *>(data)[index]);
	case LogicalTypeId::UUID:
		return Value::UUID(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(reinterpret_cast<int16_t *>(data)[index], width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(reinterpret_cast<int32_t *>(data)[index], width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(reinterpret_cast<int64_t *>(data)[index], width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(reinterpret_cast<hugeint_t *>(data)[index], width, scale);
		default:
			throw InternalException("Physical type '%s' has a width bigger than 38, which is not supported",
			                        TypeIdToString(type.InternalType()));
		}
	}
	case LogicalTypeId::ENUM: {
		switch (type.InternalType()) {
		case PhysicalType::UINT8:
			return Value::ENUM(reinterpret_cast<uint8_t *>(data)[index], type);
		case PhysicalType::UINT16:
			return Value::ENUM(reinterpret_cast<uint16_t *>(data)[index], type);
		case PhysicalType::UINT32:
			return Value::ENUM(reinterpret_cast<uint32_t *>(data)[index], type);
		default:
			throw InternalException("ENUM can only have unsigned integers as physical types");
		}
	}
	case LogicalTypeId::POINTER:
		return Value::POINTER(reinterpret_cast<uintptr_t *>(data)[index]);
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(reinterpret_cast<float *>(data)[index]);
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(reinterpret_cast<double *>(data)[index]);
	case LogicalTypeId::INTERVAL:
		return Value::INTERVAL(reinterpret_cast<interval_t *>(data)[index]);
	case LogicalTypeId::VARCHAR: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value(str.GetString());
	}
	case LogicalTypeId::BLOB: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BLOB(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::VARINT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::VARINT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::AGGREGATE_STATE: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::AGGREGATE_STATE(vector->GetType(), const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::BIT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BIT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::MAP: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::MAP(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::UNION: {
		// Remember to pass the original index_p here so we dont slice twice when looking up the tag
		// in case this is a dictionary vector
		union_tag_t tag;
		if (UnionVector::TryGetTag(*vector, index_p, tag)) {
			auto value = UnionVector::GetMember(*vector, tag).GetValue(index_p);
			auto members = UnionType::CopyMemberTypes(type);
			return Value::UNION(members, tag, std::move(value));
		} else {
			return Value(vector->GetType());
		}
	}
	case LogicalTypeId::STRUCT: {
		// we can derive the value schema from the vector schema
		auto &child_entries = StructVector::GetEntries(*vector);
		child_list_t<Value> children;
		for (idx_t child_idx = 0; child_idx < child_entries.size(); child_idx++) {
			auto &struct_child = child_entries[child_idx];
			children.push_back(make_pair(StructType::GetChildName(type, child_idx), struct_child->GetValue(index_p)));
		}
		return Value::STRUCT(std::move(children));
	}
	case LogicalTypeId::LIST: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::LIST(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::ARRAY: {
		auto stride = ArrayType::GetSize(type);
		auto offset = index * stride;
		auto &child_vec = ArrayVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offset; i < offset + stride; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::ARRAY(ArrayType::GetChildType(type), std::move(children));
	}
	default:
		throw InternalException("Unimplemented type for value access");
	}
}